

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O3

void __thiscall HFactor::updateCFT(HFactor *this,HVector *aq,HVector *ep,int *iRow,int *hint)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  vector<double,_std::allocator<double>_> *this_00;
  int *piVar2;
  double *__args;
  double dVar3;
  uint uVar4;
  int iVar5;
  iterator iVar6;
  iterator iVar7;
  pointer piVar8;
  pointer piVar9;
  pointer piVar10;
  bool bVar11;
  pointer ppVar12;
  pointer ppVar13;
  int i;
  int iVar14;
  uint uVar15;
  HVector *pHVar16;
  vector<int,std::allocator<int>> *pvVar17;
  ulong uVar18;
  pointer pdVar19;
  int *piVar20;
  pointer piVar21;
  ulong uVar22;
  pointer piVar23;
  pointer piVar24;
  long lVar25;
  size_t sVar26;
  pointer **pppiVar27;
  vector<int,std::allocator<int>> *pvVar28;
  ulong uVar29;
  size_type __new_size;
  long lVar30;
  int iVar31;
  int iVar32;
  pointer *ppiVar33;
  vector<double,std::allocator<double>> *pvVar34;
  vector<int,std::allocator<int>> *pvVar35;
  int iVar36;
  long lVar37;
  pointer *local_188 [2];
  vector<int,std::allocator<int>> *local_178;
  int local_16c;
  ulong local_168;
  vector<int,std::allocator<int>> *local_160;
  vector<int,std::allocator<int>> *local_158;
  vector<double,std::allocator<double>> *local_150;
  ulong local_148;
  vector<int,std::allocator<int>> *local_140;
  pointer *local_138;
  HVector *local_130;
  pointer ppStack_128;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> sorted_pp;
  double local_108;
  pointer *local_d8;
  pointer *local_d0;
  pointer local_c8;
  pointer *local_98;
  uint local_8c;
  int *piStack_88;
  int UendX;
  vector<int,std::allocator<int>> *local_80;
  pointer local_78 [2];
  double local_68;
  undefined8 uStack_60;
  vector<int,std::allocator<int>> *local_50;
  int local_44;
  vector<int,std::allocator<int>> *pvStack_40;
  int index_1;
  pair<int,_int> local_38;
  int index;
  
  pppiVar27 = local_188;
  local_130 = aq;
  if (aq == (HVector *)0x0) {
    local_178 = (vector<int,std::allocator<int>> *)&this->PFpivotIndex;
    uVar18 = (long)(this->PFpivotIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->PFpivotIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
    local_188[1] = &(this->PFpivotIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
    local_188[0] = local_78;
    pvVar28 = (vector<int,std::allocator<int>> *)0x1;
    pvVar35 = (vector<int,std::allocator<int>> *)0x0;
    local_138 = local_188[0];
    local_d8 = local_188[0];
    local_d0 = local_188[0];
    local_98 = local_188[0];
  }
  else {
    pHVar16 = aq;
    pvVar35 = (vector<int,std::allocator<int>> *)0x0;
    do {
      pvVar28 = pvVar35;
      pHVar16 = pHVar16->next;
      pvVar35 = pvVar28 + 1;
    } while (pHVar16 != (HVector *)0x0);
    uVar22 = (long)pvVar35 * 8 + 0xfU & 0xfffffffffffffff0;
    ppiVar33 = (pointer *)((long)local_188 - uVar22);
    local_98 = (pointer *)((long)ppiVar33 - uVar22);
    pvVar17 = (vector<int,std::allocator<int>> *)0x0;
    do {
      ppiVar33[(long)pvVar17] = &aq->size;
      local_98[(long)pvVar17] = &ep->size;
      aq = aq->next;
      ep = ep->next;
      pvVar17 = pvVar17 + 1;
    } while (pvVar35 != pvVar17);
    local_178 = (vector<int,std::allocator<int>> *)&this->PFpivotIndex;
    local_188[1] = &(this->PFpivotIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
    uVar18 = (long)(this->PFpivotIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->PFpivotIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
    local_d0 = (pointer *)((long)local_98 - ((long)pvVar35 * 4 + 0xfU & 0xfffffffffffffff0));
    local_d8 = (pointer *)((long)local_d0 - uVar22);
    pppiVar27 = (pointer **)((long)local_d8 - uVar22);
    piVar21 = (this->UpivotLookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar19 = (this->UpivotValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar30 = 0;
    pvVar17 = pvVar35;
    do {
      iVar14 = *(int *)((long)iRow + lVar30);
      iVar31 = piVar21[iVar14];
      *(int *)((long)local_d0 + lVar30) = iVar31;
      *(double *)((long)local_d8 + lVar30 * 2) = pdVar19[iVar31];
      *(undefined8 *)((long)pppiVar27 + lVar30 * 2) =
           *(undefined8 *)
            (*(long *)(*(long *)((long)ppiVar33 + lVar30 * 2) + 0x20) + (long)iVar14 * 8);
      lVar30 = lVar30 + 4;
      pvVar17 = pvVar17 + -1;
    } while (pvVar17 != (vector<int,std::allocator<int>> *)0x0);
    pvVar28 = pvVar28 + 2;
    local_188[0] = ppiVar33;
    local_138 = (pointer *)pppiVar27;
  }
  uVar22 = (long)pvVar28 * 4 + 0xfU & 0xfffffffffffffff0;
  lVar30 = -((long)pvVar35 * 8 + 0xfU & 0xfffffffffffffff0) - uVar22;
  local_148 = (ulong)((long)(this->Uindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(this->Uindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2;
  *(int *)((long)pppiVar27 - uVar22) = (int)local_148;
  ppStack_128 = (pointer)0x0;
  sorted_pp.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sorted_pp.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (local_130 != (HVector *)0x0) {
    pvVar1 = &this->Uindex;
    local_50 = (vector<int,std::allocator<int>> *)&this->iwork;
    local_80 = (vector<int,std::allocator<int>> *)&this->PFindex;
    this_00 = &this->Uvalue;
    local_168 = (ulong)(int)(uVar18 >> 2);
    pvStack_40 = (vector<int,std::allocator<int>> *)0x0;
    local_140 = pvVar35;
    piStack_88 = iRow;
    do {
      piVar21 = (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish != piVar21) {
        (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = piVar21;
      }
      piVar21 = local_188[0][(long)pvStack_40];
      if (piVar21[0x21] < 1) {
        pdVar19 = (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
      }
      else {
        lVar37 = 0;
        do {
          pvVar28 = local_50;
          iVar14 = *(int *)(*(long *)(piVar21 + 0x22) + lVar37 * 4);
          local_38.first = iVar14;
          local_68 = *(double *)(*(long *)(piVar21 + 0x28) + lVar37 * 8);
          iVar6._M_current =
               (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar6._M_current ==
              (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            *(undefined8 *)((long)pppiVar27 + lVar30 + -8) = 0x122add;
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (pvVar28,iVar6,&local_38.first);
          }
          else {
            *iVar6._M_current = iVar14;
            (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar6._M_current + 1;
          }
          pdVar19 = (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pdVar19[local_38.first] = local_68;
          lVar37 = lVar37 + 1;
        } while (lVar37 < piVar21[0x21]);
      }
      piVar20 = piStack_88;
      if (pvStack_40 != (vector<int,std::allocator<int>> *)0x0) {
        pvVar28 = (vector<int,std::allocator<int>> *)0x0;
        do {
          pvVar35 = local_50;
          iVar14 = piVar20[(long)pvVar28];
          local_38.first = iVar14;
          piVar21 = (this->PFstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          local_68 = pdVar19[iVar14];
          iVar31 = piVar21[(long)(pvVar28 + local_168)];
          lVar37 = (long)iVar31;
          iVar32 = piVar21[(long)(pvVar28 + local_168 + 1)];
          if (iVar31 < iVar32) {
            do {
              local_68 = local_68 -
                         pdVar19[*(int *)(*(long *)local_80 + lVar37 * 4)] *
                         (this->PFvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data._M_start[lVar37];
              lVar37 = lVar37 + 1;
            } while (iVar32 != lVar37);
          }
          iVar6._M_current =
               (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar6._M_current ==
              (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            *(undefined8 *)((long)pppiVar27 + lVar30 + -8) = 0x122b9c;
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (pvVar35,iVar6,&local_38.first);
            pdVar19 = (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
          }
          else {
            *iVar6._M_current = iVar14;
            (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar6._M_current + 1;
          }
          pdVar19[local_38.first] = local_68;
          pvVar28 = pvVar28 + 1;
        } while (pvVar28 != pvStack_40);
      }
      ppiVar33 = local_138;
      iVar14 = piVar20[(long)pvStack_40];
      local_160 = (vector<int,std::allocator<int>> *)pdVar19[iVar14];
      pdVar19[iVar14] = 0.0;
      local_158 = (vector<int,std::allocator<int>> *)
                  (long)*(int *)((long)pppiVar27 + ((long)pvStack_40 * 4 - uVar22));
      piVar21 = (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar23 = (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (piVar23 != piVar21) {
        uVar18 = 0;
        uVar29 = 1;
        do {
          local_44 = piVar21[uVar18];
          pdVar19 = (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          local_38 = *(pair<int,_int> *)(pdVar19 + local_44);
          pdVar19[local_44] = 0.0;
          if (1e-14 < ABS((double)local_38)) {
            iVar6._M_current =
                 (this->Uindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar6._M_current ==
                (this->Uindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              *(undefined8 *)((long)pppiVar27 + lVar30 + -8) = 0x122c7a;
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)pvVar1,iVar6,&local_44);
            }
            else {
              *iVar6._M_current = local_44;
              (this->Uindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar6._M_current + 1;
            }
            iVar7._M_current =
                 (this->Uvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar7._M_current ==
                (this->Uvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              *(undefined8 *)((long)pppiVar27 + lVar30 + -8) = 0x122cb0;
              std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                        ((vector<double,std::allocator<double>> *)this_00,iVar7,(double *)&local_38)
              ;
            }
            else {
              *iVar7._M_current = (double)local_38;
              (this->Uvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar7._M_current + 1;
            }
          }
          piVar21 = (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          piVar23 = (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          bVar11 = uVar29 < (ulong)((long)piVar23 - (long)piVar21 >> 2);
          uVar18 = uVar29;
          uVar29 = (ulong)((int)uVar29 + 1);
        } while (bVar11);
      }
      pvVar34 = (vector<double,std::allocator<double>> *)
                ((ulong)((long)(this->Uindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(this->Uindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 2);
      *(int *)((long)pppiVar27 + (long)pvStack_40 * 4 + (4 - uVar22)) = (int)pvVar34;
      piVar24 = local_d8[(long)pvStack_40];
      *(double *)((long)pppiVar27 + (long)pvStack_40 * 8 + lVar30) =
           (double)ppiVar33[(long)pvStack_40] * (double)piVar24;
      if (piVar23 != piVar21) {
        (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = piVar21;
      }
      piVar21 = local_98[(long)pvStack_40];
      if (piVar21[0x21] < 1) {
        pdVar19 = (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
      }
      else {
        lVar37 = 0;
        do {
          pvVar28 = local_50;
          iVar14 = *(int *)(*(long *)(piVar21 + 0x22) + lVar37 * 4);
          local_38.first = iVar14;
          local_68 = *(double *)(*(long *)(piVar21 + 0x28) + lVar37 * 8);
          iVar6._M_current =
               (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar6._M_current ==
              (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            *(undefined8 *)((long)pppiVar27 + lVar30 + -8) = 0x122d8d;
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (pvVar28,iVar6,&local_38.first);
          }
          else {
            *iVar6._M_current = iVar14;
            (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar6._M_current + 1;
          }
          pdVar19 = (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pdVar19[local_38.first] = local_68;
          lVar37 = lVar37 + 1;
        } while (lVar37 < piVar21[0x21]);
      }
      piVar20 = piStack_88;
      local_150 = pvVar34;
      if (pvStack_40 != (vector<int,std::allocator<int>> *)0x0) {
        pvVar28 = (vector<int,std::allocator<int>> *)0x0;
        do {
          iVar14 = ppStack_128[(long)pvVar28].second;
          iVar31 = piStack_88[iVar14];
          dVar3 = pdVar19[iVar31];
          if ((1e-14 < ABS(dVar3)) && (piVar21 = local_98[iVar14], 0 < piVar21[0x21])) {
            piVar23 = local_d8[iVar14];
            lVar37 = 0;
            do {
              pvVar35 = local_50;
              iVar14 = *(int *)(*(long *)(piVar21 + 0x22) + lVar37 * 4);
              local_38.first = iVar14;
              local_68 = *(double *)(*(long *)(piVar21 + 0x28) + lVar37 * 8);
              iVar6._M_current =
                   (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar6._M_current ==
                  (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                *(undefined8 *)((long)pppiVar27 + lVar30 + -8) = 0x122e85;
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          (pvVar35,iVar6,&local_38.first);
                pdVar19 = (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
              }
              else {
                *iVar6._M_current = iVar14;
                (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar6._M_current + 1;
              }
              pdVar19[local_38.first] =
                   local_68 * dVar3 * -(double)piVar23 + pdVar19[local_38.first];
              lVar37 = lVar37 + 1;
            } while (lVar37 < piVar21[0x21]);
          }
          piVar20 = piStack_88;
          pdVar19[iVar31] = 0.0;
          pvVar28 = pvVar28 + 1;
        } while (pvVar28 != pvStack_40);
        uVar18 = local_148 & 0xffffffff;
        pvVar28 = (vector<int,std::allocator<int>> *)0x0;
        do {
          pvVar35 = local_50;
          iVar14 = piVar20[(long)pvVar28];
          local_38.first = iVar14;
          local_68 = pdVar19[iVar14];
          uVar4 = *(uint *)((long)pppiVar27 + (long)pvVar28 * 4 + (4 - uVar22));
          if ((int)uVar18 < (int)uVar4) {
            lVar37 = (long)(int)uVar18;
            do {
              local_68 = local_68 -
                         pdVar19[(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_start[lVar37]] *
                         (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start[lVar37];
              lVar37 = lVar37 + 1;
            } while ((int)uVar4 != lVar37);
          }
          dVar3 = *(double *)((long)pppiVar27 + (long)pvVar28 * 8 + lVar30);
          iVar6._M_current =
               (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar6._M_current ==
              (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            *(undefined8 *)((long)pppiVar27 + lVar30 + -8) = 0x122f68;
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (pvVar35,iVar6,&local_38.first);
            pdVar19 = (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
          }
          else {
            *iVar6._M_current = iVar14;
            (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar6._M_current + 1;
          }
          pvVar28 = pvVar28 + 1;
          pdVar19[local_38.first] = local_68 / dVar3;
          uVar18 = (ulong)uVar4;
        } while (pvVar28 != pvStack_40);
      }
      pvVar28 = local_140;
      dVar3 = 0.0;
      if ((int)local_158 < (int)local_150) {
        pvVar35 = local_158;
        dVar3 = 0.0;
        do {
          dVar3 = dVar3 + pdVar19[(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_start[(long)pvVar35]] *
                          (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start[(long)pvVar35];
          pvVar35 = pvVar35 + 1;
        } while ((vector<int,std::allocator<int>> *)(long)(int)local_150 != pvVar35);
      }
      piVar2 = piVar20 + (long)pvStack_40;
      *(double *)((long)pppiVar27 + (long)pvStack_40 * 8 + lVar30) =
           dVar3 * (double)piVar24 + (double)local_160;
      pdVar19[*piVar2] = 0.0;
      piVar21 = (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar23 = (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (piVar23 != piVar21) {
        local_108 = -(double)piVar24;
        uVar18 = 0;
        uVar29 = 1;
        do {
          pvVar35 = local_80;
          local_44 = piVar21[uVar18];
          pdVar19 = (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          local_68 = pdVar19[local_44];
          pdVar19[local_44] = 0.0;
          uStack_60 = 0;
          if (1e-14 < ABS(local_68)) {
            iVar6._M_current =
                 (this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar6._M_current ==
                (this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              *(undefined8 *)((long)pppiVar27 + lVar30 + -8) = 0x1230a0;
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (pvVar35,iVar6,&local_44);
            }
            else {
              *iVar6._M_current = local_44;
              (this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar6._M_current + 1;
            }
            local_38 = (pair<int,_int>)(local_68 * local_108);
            iVar7._M_current =
                 (this->PFvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar7._M_current ==
                (this->PFvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              *(undefined8 *)((long)pppiVar27 + lVar30 + -8) = 0x1230e3;
              std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                        (&this->PFvalue,iVar7,(double *)&local_38);
            }
            else {
              *iVar7._M_current = (double)local_38;
              (this->PFvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar7._M_current + 1;
            }
            piVar21 = (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            piVar23 = (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          }
          bVar11 = uVar29 < (ulong)((long)piVar23 - (long)piVar21 >> 2);
          uVar18 = uVar29;
          uVar29 = (ulong)((int)uVar29 + 1);
        } while (bVar11);
      }
      pvVar35 = local_178;
      iVar6._M_current =
           (this->PFpivotIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (this->PFpivotIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        *(undefined8 *)((long)pppiVar27 + lVar30 + -8) = 0x123137;
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(pvVar35,iVar6,piVar2);
      }
      else {
        *iVar6._M_current = *piVar2;
        *local_188[1] = iVar6._M_current + 1;
      }
      iVar6._M_current =
           (this->PFstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      iVar14 = (int)((ulong)((long)(this->PFindex).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->PFindex).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 2);
      this->FtotalX = (this->FtotalX - iVar6._M_current[-1]) + iVar14 + 1;
      this->UtotalX = this->UtotalX + (iVar14 - iVar6._M_current[-1]);
      local_38.first = iVar14;
      if (iVar6._M_current ==
          (this->PFstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        *(undefined8 *)((long)pppiVar27 + lVar30 + -8) = 0x123196;
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&this->PFstart,iVar6,&local_38.first);
      }
      else {
        *iVar6._M_current = iVar14;
        (this->PFstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar6._M_current + 1;
      }
      ppVar12 = sorted_pp.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      local_38 = (pair<int,_int>)
                 ((long)pvStack_40 << 0x20 | (ulong)*(uint *)((long)local_d0 + (long)pvStack_40 * 4)
                 );
      if (sorted_pp.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          sorted_pp.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        *(undefined8 *)((long)pppiVar27 + lVar30 + -8) = 0x1231e9;
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        _M_realloc_insert<std::pair<int,int>>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&ppStack_128,
                   (iterator)ppVar12,&local_38);
      }
      else {
        *sorted_pp.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
         _M_impl.super__Vector_impl_data._M_start = local_38;
        sorted_pp.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start =
             sorted_pp.
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
      }
      ppVar13 = sorted_pp.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppVar12 = ppStack_128;
      if (ppStack_128 !=
          sorted_pp.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        uVar18 = (long)sorted_pp.
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start - (long)ppStack_128 >> 3;
        lVar37 = 0x3f;
        if (uVar18 != 0) {
          for (; uVar18 >> lVar37 == 0; lVar37 = lVar37 + -1) {
          }
        }
        *(undefined8 *)((long)pppiVar27 + lVar30 + -8) = 0x12321e;
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (ppVar12,ppVar13,((uint)lVar37 ^ 0x3f) * 2 ^ 0x7e);
        *(undefined8 *)((long)pppiVar27 + lVar30 + -8) = 0x123229;
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (ppVar12,ppVar13);
      }
      pvStack_40 = pvStack_40 + 1;
    } while (pvStack_40 != pvVar28);
    if (local_130 != (HVector *)0x0) {
      local_80 = (vector<int,std::allocator<int>> *)&this->URstart;
      local_160 = (vector<int,std::allocator<int>> *)&this->Ulastp;
      pvVar1 = &this->URspace;
      local_158 = (vector<int,std::allocator<int>> *)&this->UpivotIndex;
      local_150 = (vector<double,std::allocator<double>> *)&this->UpivotValue;
      pvVar28 = (vector<int,std::allocator<int>> *)0x0;
      do {
        iVar14 = piVar20[(long)pvVar28];
        local_38.first = iVar14;
        local_68 = (double)(long)*(int *)((long)local_d0 + (long)pvVar28 * 4);
        piVar24 = (this->URlastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_c8 = (this->URstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        iVar31 = (local_c8[(long)local_68] - piVar24[(long)local_68]) + this->FtotalX;
        this->FtotalX = iVar31;
        iVar32 = (local_c8[(long)local_68] - piVar24[(long)local_68]) + this->UtotalX;
        this->UtotalX = iVar32;
        lVar37 = (long)local_c8[(long)local_68];
        piVar21 = (this->Ustart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar23 = (this->Ulastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (local_c8[(long)local_68] < piVar24[(long)local_68]) {
          piVar8 = (this->URindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar9 = (this->UpivotLookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar10 = (this->Uindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pdVar19 = (this->Uvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          do {
            iVar31 = piVar9[piVar8[lVar37]];
            iVar32 = piVar21[iVar31];
            iVar5 = piVar23[iVar31];
            piVar23[iVar31] = iVar5 + -1;
            iVar31 = iVar32;
            if (iVar32 < iVar5) {
              piVar20 = piVar10 + iVar32;
              do {
                iVar31 = iVar32;
                if (*piVar20 == iVar14) break;
                iVar32 = iVar32 + 1;
                piVar20 = piVar20 + 1;
                iVar31 = iVar5;
              } while (iVar5 != iVar32);
            }
            piVar10[iVar31] = piVar10[(long)iVar5 + -1];
            pdVar19[iVar31] = pdVar19[(long)iVar5 + -1];
            lVar37 = lVar37 + 1;
          } while (lVar37 < piVar24[(long)local_68]);
          iVar31 = this->FtotalX;
          iVar32 = this->UtotalX;
        }
        iVar31 = (piVar21[(long)local_68] - piVar23[(long)local_68]) + iVar31;
        this->FtotalX = iVar31;
        iVar32 = (piVar21[(long)local_68] - piVar23[(long)local_68]) + iVar32;
        this->UtotalX = iVar32;
        lVar37 = (long)piVar21[(long)local_68];
        if (piVar21[(long)local_68] < piVar23[(long)local_68]) {
          piVar21 = (this->UpivotLookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          piVar8 = (this->Uindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar9 = (this->URindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar10 = (this->URspace).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pdVar19 = (this->URvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          do {
            iVar31 = piVar21[piVar8[lVar37]];
            iVar32 = local_c8[iVar31];
            iVar5 = piVar24[iVar31];
            piVar24[iVar31] = iVar5 + -1;
            iVar36 = iVar32;
            if (iVar32 < iVar5) {
              piVar20 = piVar9 + iVar32;
              do {
                iVar36 = iVar32;
                if (*piVar20 == iVar14) break;
                iVar32 = iVar32 + 1;
                piVar20 = piVar20 + 1;
                iVar36 = iVar5;
              } while (iVar5 != iVar32);
            }
            piVar20 = piVar10 + iVar31;
            *piVar20 = *piVar20 + 1;
            piVar9[iVar36] = piVar9[(long)iVar5 + -1];
            pdVar19[iVar36] = pdVar19[(long)iVar5 + -1];
            lVar37 = lVar37 + 1;
          } while (lVar37 < piVar23[(long)local_68]);
          iVar31 = this->FtotalX;
          iVar32 = this->UtotalX;
        }
        local_44 = (int)local_148;
        uVar4 = *(uint *)((long)pppiVar27 + (long)pvVar28 * 4 + (4 - uVar22));
        iVar14 = uVar4 - local_44;
        this->FtotalX = iVar14 + 1 + iVar31;
        this->UtotalX = iVar32 + iVar14;
        local_8c = uVar4;
        local_50 = pvVar28;
        if (iVar14 != 0 && local_44 <= (int)uVar4) {
          lVar37 = (long)local_44;
          piVar21 = (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          do {
            iVar14 = (this->UpivotLookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start
                     [(this->Uindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar37]];
            iVar31 = piVar21[iVar14];
            if (iVar31 == 0) {
              lVar25 = (long)local_c8[iVar14];
              pvStack_40 = (vector<int,std::allocator<int>> *)(long)piVar24[iVar14];
              uVar15 = piVar24[iVar14] - local_c8[iVar14];
              local_168 = (ulong)uVar15;
              iVar31 = (int)((double)(int)uVar15 * 1.1 + 5.0);
              iVar32 = (int)((ulong)((long)(this->URindex).
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_finish -
                                    (long)(this->URindex).
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start) >> 2);
              __new_size = (size_type)(iVar32 + iVar31);
              *(undefined8 *)((long)pppiVar27 + lVar30 + -8) = 0x12357b;
              std::vector<int,_std::allocator<int>_>::resize(&this->URindex,__new_size);
              *(undefined8 *)((long)pppiVar27 + lVar30 + -8) = 0x12358a;
              std::vector<double,_std::allocator<double>_>::resize(&this->URvalue,__new_size);
              sVar26 = (long)pvStack_40 * 4 + lVar25 * -4;
              if (sVar26 != 0) {
                piVar21 = (this->URindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                *(undefined8 *)((long)pppiVar27 + lVar30 + -8) = 0x1235c3;
                memmove(piVar21 + iVar32,piVar21 + lVar25,sVar26);
              }
              sVar26 = (long)pvStack_40 * 8 + lVar25 * -8;
              if (sVar26 != 0) {
                pdVar19 = (this->URvalue).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                *(undefined8 *)((long)pppiVar27 + lVar30 + -8) = 0x1235f7;
                memmove(pdVar19 + iVar32,pdVar19 + lVar25,sVar26);
              }
              local_c8 = *(pointer *)local_80;
              local_c8[iVar14] = iVar32;
              piVar24 = (this->URlastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              piVar24[iVar14] = (int)local_168 + iVar32;
              iVar31 = iVar31 - (int)local_168;
              piVar21 = (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              piVar21[iVar14] = iVar31;
            }
            piVar21[iVar14] = iVar31 + -1;
            iVar31 = piVar24[iVar14];
            piVar24[iVar14] = iVar31 + 1;
            (this->URindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar31] = local_38.first;
            (this->URvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar31] =
                 (this->Uvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar37];
            lVar37 = lVar37 + 1;
          } while (lVar37 < (int)local_8c);
        }
        iVar6._M_current =
             (this->Ustart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar6._M_current ==
            (this->Ustart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          *(undefined8 *)((long)pppiVar27 + lVar30 + -8) = 0x1236cb;
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&this->Ustart,iVar6,&local_44);
        }
        else {
          *iVar6._M_current = local_44;
          (this->Ustart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar6._M_current + 1;
        }
        pvVar28 = local_50;
        piVar20 = piStack_88;
        pvVar17 = local_140;
        pvVar35 = local_160;
        iVar6._M_current =
             (this->Ulastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar6._M_current ==
            (this->Ulastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          *(undefined8 *)((long)pppiVar27 + lVar30 + -8) = 0x123719;
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (pvVar35,iVar6,(int *)&local_8c);
        }
        else {
          *iVar6._M_current = local_8c;
          (this->Ulastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar6._M_current + 1;
        }
        pvVar35 = local_80;
        piVar21 = (this->URstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        iVar6._M_current =
             (this->URstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        piVar2 = piVar21 + (long)local_68;
        if (iVar6._M_current ==
            (this->URstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          *(undefined8 *)((long)pppiVar27 + lVar30 + -8) = 0x123752;
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(pvVar35,iVar6,piVar2);
          piVar21 = *(pointer *)local_80;
        }
        else {
          *iVar6._M_current = *piVar2;
          (this->URstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar6._M_current + 1;
        }
        piVar2 = piVar21 + (long)local_68;
        iVar6._M_current =
             (this->URlastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar6._M_current ==
            (this->URlastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          *(undefined8 *)((long)pppiVar27 + lVar30 + -8) = 0x123792;
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&this->URlastp,iVar6,piVar2);
          local_16c = *(int *)(*(long *)local_80 + (long)local_68 * 4);
        }
        else {
          local_16c = *piVar2;
          *iVar6._M_current = local_16c;
          (this->URlastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar6._M_current + 1;
        }
        local_16c = ((this->URlastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(long)local_68] +
                    (this->URspace).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[(long)local_68]) - local_16c;
        iVar6._M_current =
             (this->URspace).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar6._M_current ==
            (this->URspace).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          *(undefined8 *)((long)pppiVar27 + lVar30 + -8) = 0x1237ee;
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar6,&local_16c);
        }
        else {
          *iVar6._M_current = local_16c;
          (this->URspace).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar6._M_current + 1;
        }
        pvVar35 = local_158;
        iVar6._M_current =
             (this->UpivotIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        piVar21 = (this->UpivotIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        (this->UpivotLookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[local_38.first] =
             (int)((ulong)((long)iVar6._M_current - (long)piVar21) >> 2);
        piVar21[(long)local_68] = -1;
        if (iVar6._M_current ==
            (this->UpivotIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          *(undefined8 *)((long)pppiVar27 + lVar30 + -8) = 0x12384a;
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (pvVar35,iVar6,&local_38.first);
        }
        else {
          *iVar6._M_current = local_38.first;
          (this->UpivotIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar6._M_current + 1;
        }
        pvVar34 = local_150;
        __args = (double *)((long)pppiVar27 + (long)pvVar28 * 8 + lVar30);
        iVar7._M_current =
             (this->UpivotValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar7._M_current ==
            (this->UpivotValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          *(undefined8 *)((long)pppiVar27 + lVar30 + -8) = 0x123886;
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    (pvVar34,iVar7,__args);
        }
        else {
          *iVar7._M_current = *__args;
          (this->UpivotValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar7._M_current + 1;
        }
        pvVar28 = pvVar28 + 1;
        local_148 = (ulong)uVar4;
      } while (pvVar28 != pvVar17);
    }
  }
  ppVar12 = ppStack_128;
  if (ppStack_128 != (pointer)0x0) {
    *(undefined8 *)((long)pppiVar27 + lVar30 + -8) = 0x1238b4;
    operator_delete(ppVar12);
  }
  return;
}

Assistant:

void HFactor::updateCFT(HVector *aq, HVector *ep, int *iRow, int *hint) {

    /*
     * In the major update loop, the prefix
     *
     * c(p) = current working pivot
     * p(p) = previous pivot  (0 =< pp < cp)
     */

    int numUpdate = 0;
    for (HVector *vec = aq; vec != 0; vec = vec->next)
        numUpdate++;

    HVector* aqWork[numUpdate];
    HVector* epWork[numUpdate];

    for (int i = 0; i < numUpdate; i++) {
        aqWork[i] = aq;
        epWork[i] = ep;
        aq = aq->next;
        ep = ep->next;
    }

    // Pivot related buffers
    int PFnp0 = PFpivotIndex.size();
    int pLogic[numUpdate];
    double pValue[numUpdate];
    double pAlpha[numUpdate];
    for (int cp = 0; cp < numUpdate; cp++) {
        int cRow = iRow[cp];
        int iLogic = UpivotLookup[cRow];
        pLogic[cp] = iLogic;
        pValue[cp] = UpivotValue[iLogic];
        pAlpha[cp] = aqWork[cp]->array[cRow];
    }

    // Temporary U pointers
    int Tstart[numUpdate + 1];
    double Tpivot[numUpdate];
    Tstart[0] = Uindex.size();

    // Logically sorted previous row_ep
    vector<pair<int, int> > sorted_pp;

    // Major update loop
    for (int cp = 0; cp < numUpdate; cp++) {
        // 1. Expand partial FTRAN result to buffer
        iwork.clear();
        for (int i = 0; i < aqWork[cp]->packCount; i++) {
            int index = aqWork[cp]->packIndex[i];
            double value = aqWork[cp]->packValue[i];
            iwork.push_back(index);
            dwork[index] = value;
        }

        // 2. Update partial FTRAN result by recent FT matrix
        for (int pp = 0; pp < cp; pp++) {
            int pRow = iRow[pp];
            double value = dwork[pRow];
            int PFpp = pp + PFnp0;
            for (int i = PFstart[PFpp]; i < PFstart[PFpp + 1]; i++)
                value -= dwork[PFindex[i]] * PFvalue[i];
            iwork.push_back(pRow); // OK to duplicate
            dwork[pRow] = value;
        }

        // 3. Store the partial FTRAN result to matirx U
        double ppaq = dwork[iRow[cp]]; // pivot of the partial aq
        dwork[iRow[cp]] = 0;
        int UcountX = Tstart[cp];
        int UstartX = UcountX;
        for (unsigned i = 0; i < iwork.size(); i++) {
            int index = iwork[i];
            double value = dwork[index];
            dwork[index] = 0; // This effectively removes all duplication
            if (fabs(value) > HSOL_CONST_TINY) {
                Uindex.push_back(index);
                Uvalue.push_back(value);
            }
        }
        UcountX = Uindex.size();
        Tstart[cp + 1] = UcountX;
        Tpivot[cp] = pValue[cp] * pAlpha[cp];

        // 4. Expand partial BTRAN result to buffer
        iwork.clear();
        for (int i = 0; i < epWork[cp]->packCount; i++) {
            int index = epWork[cp]->packIndex[i];
            double value = epWork[cp]->packValue[i];
            iwork.push_back(index);
            dwork[index] = value;
        }

        // 5. Delete logical later rows (in logical order)
        for (int isort = 0; isort < cp; isort++) {
            int pp = sorted_pp[isort].second;
            int pRow = iRow[pp];
            double multiplier = -pValue[pp] * dwork[pRow];
            if (fabs(dwork[pRow]) > HSOL_CONST_TINY) {
                for (int i = 0; i < epWork[pp]->packCount; i++) {
                    int index = epWork[pp]->packIndex[i];
                    double value = epWork[pp]->packValue[i];
                    iwork.push_back(index);
                    dwork[index] += value * multiplier;
                }
            }
            dwork[pRow] = 0; // Force to be 0
        }

        // 6. Update partial BTRAN result by recent U columns
        for (int pp = 0; pp < cp; pp++) {
            int kpivot = iRow[pp];
            double value = dwork[kpivot];
            for (int k = Tstart[pp]; k < Tstart[pp + 1]; k++)
                value -= dwork[Uindex[k]] * Uvalue[k];
            value /= Tpivot[pp];
            iwork.push_back(kpivot);
            dwork[kpivot] = value; // Again OK to duplicate
        }

        // 6.x compute current alpha
        double thex = 0;
        for (int k = UstartX; k < UcountX; k++) {
            int index = Uindex[k];
            double value = Uvalue[k];
            thex += dwork[index] * value;
        }
        Tpivot[cp] = ppaq + thex * pValue[cp];

        // 7. Store BTRAN result to FT elimination, update logic helper
        dwork[iRow[cp]] = 0;
        double pivotX = -pValue[cp];
        for (unsigned i = 0; i < iwork.size(); i++) {
            int index = iwork[i];
            double value = dwork[index];
            dwork[index] = 0;
            if (fabs(value) > HSOL_CONST_TINY) {
                PFindex.push_back(index);
                PFvalue.push_back(value * pivotX);
            }
        }
        PFpivotIndex.push_back(iRow[cp]);
        FtotalX += PFindex.size() - PFstart.back() + 1;
        UtotalX += PFindex.size() - PFstart.back();
        PFstart.push_back(PFindex.size());

        // 8. Update the sorted ep
        sorted_pp.push_back(make_pair(pLogic[cp], cp));
        sort(sorted_pp.begin(), sorted_pp.end());
    }

    // Now modify the U matrix
    for (int cp = 0; cp < numUpdate; cp++) {
        // 1. Delete pivotal row from U
        int cIndex = iRow[cp];
        int cLogic = pLogic[cp];
        FtotalX -= URlastp[cLogic] - URstart[cLogic];
        UtotalX -= URlastp[cLogic] - URstart[cLogic];
        for (int k = URstart[cLogic]; k < URlastp[cLogic]; k++) {
            // Find the pivotal position
            int iLogic = UpivotLookup[URindex[k]];
            int iFind = Ustart[iLogic];
            int iLast = --Ulastp[iLogic];
            for (; iFind <= iLast; iFind++)
                if (Uindex[iFind] == cIndex)
                    break;
            // Put last to find, and delete last
            Uindex[iFind] = Uindex[iLast];
            Uvalue[iFind] = Uvalue[iLast];
        }

        // 2. Delete pivotal column from UR
        FtotalX -= Ulastp[cLogic] - Ustart[cLogic];
        UtotalX -= Ulastp[cLogic] - Ustart[cLogic];
        for (int k = Ustart[cLogic]; k < Ulastp[cLogic]; k++) {
            // Find the pivotal position
            int iLogic = UpivotLookup[Uindex[k]];
            int iFind = URstart[iLogic];
            int iLast = --URlastp[iLogic];
            for (; iFind <= iLast; iFind++)
                if (URindex[iFind] == cIndex)
                    break;
            // Put last to find, and delete last
            URspace[iLogic]++;
            URindex[iFind] = URindex[iLast];
            URvalue[iFind] = URvalue[iLast];
        }

        // 3. Insert the (stored) partial FTRAN to the row matrix
        int UstartX = Tstart[cp];
        int UendX = Tstart[cp + 1];
        FtotalX += UendX - UstartX + 1;
        UtotalX += UendX - UstartX;
        // Store column as UR elements
        for (int k = UstartX; k < UendX; k++) {
            // Which ETA file
            int iLogic = UpivotLookup[Uindex[k]];

            // Move row to the end if necessary
            if (URspace[iLogic] == 0) {
                // Make pointers
                int row_start = URstart[iLogic];
                int row_count = URlastp[iLogic] - row_start;
                int new_start = URindex.size();
                int new_space = row_count * 1.1 + 5;

                // Check matrix UR
                URindex.resize(new_start + new_space);
                URvalue.resize(new_start + new_space);

                // Move elements
                int iFrom = row_start;
                int iEnd = row_start + row_count;
                int iTo = new_start;
                copy(&URindex[iFrom], &URindex[iEnd], &URindex[iTo]);
                copy(&URvalue[iFrom], &URvalue[iEnd], &URvalue[iTo]);

                // Save new pointers
                URstart[iLogic] = new_start;
                URlastp[iLogic] = new_start + row_count;
                URspace[iLogic] = new_space - row_count;
            }

            // Put into the next available space
            URspace[iLogic]--;
            int iPut = URlastp[iLogic]++;
            URindex[iPut] = cIndex;
            URvalue[iPut] = Uvalue[k];
        }

        // 4. Save pointers
        Ustart.push_back(UstartX);
        Ulastp.push_back(UendX);

        URstart.push_back(URstart[cLogic]);
        URlastp.push_back(URstart[cLogic]);
        URspace.push_back(URspace[cLogic] + URlastp[cLogic] - URstart[cLogic]);

        UpivotLookup[cIndex] = UpivotIndex.size();
        UpivotIndex[cLogic] = -1;
        UpivotIndex.push_back(cIndex);
        UpivotValue.push_back(Tpivot[cp]);
    }

//    // See if we want refactor
//    if (UtotalX > UmeritX && PFpivotIndex.size() > 100)
//        *hint = 1;

}